

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O0

Expression * __thiscall
wasm::SExpressionWasmBuilder::makeBrOnNull(SExpressionWasmBuilder *this,Element *s,bool onFail)

{
  Name name_00;
  BrOnOp op_00;
  Expression *ref_00;
  Element *pEVar1;
  BrOn *pBVar2;
  Type local_60;
  Expression *local_58;
  char *local_50;
  Builder local_48;
  BrOnOp local_3c;
  Expression *pEStack_38;
  BrOnOp op;
  Expression *ref;
  Name name;
  int i;
  bool onFail_local;
  Element *s_local;
  SExpressionWasmBuilder *this_local;
  
  name.super_IString.str._M_str._0_4_ = 2;
  name.super_IString.str._M_str._7_1_ = onFail;
  pEVar1 = Element::operator[](s,1);
  _ref = (string_view)getLabel(this,pEVar1,Break);
  pEVar1 = Element::operator[](s,(uint)name.super_IString.str._M_str);
  pEStack_38 = parseExpression(this,pEVar1);
  local_3c = (BrOnOp)((name.super_IString.str._M_str._7_1_ & 1) != 0);
  Builder::Builder(&local_48,this->wasm);
  ref_00 = pEStack_38;
  op_00 = local_3c;
  local_58 = ref;
  local_50 = (char *)name.super_IString.str._M_len;
  wasm::Type::Type(&local_60,none);
  name_00.super_IString.str._M_str = local_50;
  name_00.super_IString.str._M_len = (size_t)local_58;
  pBVar2 = Builder::makeBrOn(&local_48,op_00,name_00,ref_00,local_60);
  return (Expression *)pBVar2;
}

Assistant:

Expression* SExpressionWasmBuilder::makeBrOnNull(Element& s, bool onFail) {
  int i = 1;
  auto name = getLabel(*s[i++]);
  auto* ref = parseExpression(*s[i]);
  auto op = onFail ? BrOnNonNull : BrOnNull;
  return Builder(wasm).makeBrOn(op, name, ref);
}